

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::TemplatedIndexOfHelper<false,Js::RecyclableObject,unsigned_int>
              (RecyclableObject *pArr,Var search,uint fromIndex,uint toIndex,
              ScriptContext *scriptContext)

{
  code *pcVar1;
  Var pvVar2;
  bool bVar3;
  BOOL BVar4;
  uint64 uVar5;
  uint64 uVar6;
  uint i;
  Var local_48;
  Var element;
  RecyclableObject *local_38;
  
  local_48 = (Var)0x0;
  local_38 = pArr;
  if (((ulong)search & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)search & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    element = (Var)__tls_get_addr(&PTR_01548f08);
    *(undefined4 *)element = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) {
LAB_00ba4470:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)element = 0;
  }
  if (fromIndex < toIndex) {
    element = (Var)__tls_get_addr(&PTR_01548f08);
    do {
      BVar4 = TemplatedGetItem<Js::RecyclableObject>
                        (local_38,fromIndex,&local_48,scriptContext,true);
      if (BVar4 != 0) {
        if (((ulong)search & 0xffff000000000000) == 0x1000000000000) {
          if (((ulong)local_48 & 0x1ffff00000000) == 0x1000000000000 ||
              ((ulong)local_48 & 0xffff000000000000) != 0x1000000000000) {
            if (((ulong)local_48 & 0xffff000000000000) != 0x1000000000000) goto LAB_00ba437f;
          }
          else {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            pvVar2 = element;
            *(undefined4 *)element = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                        "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
            if (!bVar3) goto LAB_00ba4470;
            *(undefined4 *)pvVar2 = 0;
          }
          if (local_48 == search) {
LAB_00ba43a9:
            if (-1 < (int)fromIndex) {
              return (Var)((ulong)fromIndex | 0x1000000000000);
            }
            local_38 = (RecyclableObject *)(double)fromIndex;
            uVar5 = NumberUtilities::ToSpecial((double)local_38);
            bVar3 = NumberUtilities::IsNan((double)local_38);
            if (((bVar3) &&
                (uVar6 = NumberUtilities::ToSpecial((double)local_38), uVar6 != 0xfff8000000000000))
               && (uVar6 = NumberUtilities::ToSpecial((double)local_38), uVar6 != 0x7ff8000000000000
                  )) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              pvVar2 = element;
              *(undefined4 *)element = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                          ,0xa2,
                                          "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                          ,"We should only produce a NaN with this value");
              if (!bVar3) goto LAB_00ba4470;
              *(undefined4 *)pvVar2 = 0;
            }
            return (Var)(uVar5 ^ 0xfffc000000000000);
          }
        }
        else {
LAB_00ba437f:
          BVar4 = JavascriptOperators::StrictEqual(local_48,search,scriptContext);
          if (BVar4 != 0) goto LAB_00ba43a9;
        }
      }
      fromIndex = fromIndex + 1;
    } while (toIndex != fromIndex);
  }
  return &DAT_10000ffffffff;
}

Assistant:

Var JavascriptArray::TemplatedIndexOfHelper(T * pArr, Var search, P fromIndex, P toIndex, ScriptContext * scriptContext)
    {
        Var element = nullptr;
        bool isSearchTaggedInt = TaggedInt::Is(search);
        bool doUndefinedSearch = includesAlgorithm && JavascriptOperators::GetTypeId(search) == TypeIds_Undefined;

        Var trueValue = scriptContext->GetLibrary()->GetTrue();
        Var falseValue = scriptContext->GetLibrary()->GetFalse();

        //Consider: enumerating instead of walking all indices
        for (P i = fromIndex; i < toIndex; i++)
        {
            if (!TryTemplatedGetItem<T>(pArr, i, &element, scriptContext, !includesAlgorithm))
            {
                if (doUndefinedSearch)
                {
                    return trueValue;
                }
                continue;
            }

            if (isSearchTaggedInt && TaggedInt::Is(element))
            {
                if (element == search)
                {
                    return includesAlgorithm? trueValue : JavascriptNumber::ToVar(i, scriptContext);
                }
                continue;
            }

            if (includesAlgorithm)
            {
                //Array.prototype.includes
                if (JavascriptConversion::SameValueZero(element, search))
                {
                    return trueValue;
                }
            }
            else
            {
                //Array.prototype.indexOf
                if (JavascriptOperators::StrictEqual(element, search, scriptContext))
                {
                    return JavascriptNumber::ToVar(i, scriptContext);
                }
            }
        }

        return includesAlgorithm ? falseValue :  TaggedInt::ToVarUnchecked(-1);
    }